

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O2

uint64_t helper_pmullh_mips(uint64_t fs,uint64_t ft)

{
  long lVar1;
  LMIValue vs;
  LMIValue vt;
  
  vs.d = fs;
  vt.d = ft;
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    *(short *)((long)&vs + lVar1 * 2) =
         *(short *)((long)&vs + lVar1 * 2) * *(short *)((long)&vt + lVar1 * 2);
  }
  return vs.d;
}

Assistant:

uint64_t helper_pmullh(uint64_t fs, uint64_t ft)
{
    LMIValue vs, vt;
    unsigned i;

    vs.d = fs;
    vt.d = ft;
    for (i = 0; i < 4; ++i) {
        vs.sh[i] *= vt.sh[i];
    }
    return vs.d;
}